

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
ConcreteMachine(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
               Target *target,ROMFetcher *rom_fetcher)

{
  bool bVar1;
  undefined4 *puVar2;
  pointer ppVar3;
  size_type sVar4;
  uchar *puVar5;
  size_type length;
  uint8_t *ram;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b0;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *font_contents;
  _Self local_180;
  iterator tick_contents;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bios_contents;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_110;
  Request local_e8;
  Request local_c0;
  undefined1 local_98 [8];
  Request request;
  Name font;
  Name tick;
  Name bios;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  PCCompatible::Machine::Machine(&this->super_Machine);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  Activity::Source::Source(&this->super_Source);
  Configurable::Device::Device(&this->super_Device);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca5e50;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca5ed8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca5f20;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca5f38;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca5f68;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca5fa8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca5fc0;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00ca5ff8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca6010;
  PIC::PIC(&this->pic_);
  DMA::DMA(&this->dma_);
  PCSpeaker::PCSpeaker(&this->speaker_);
  MDA::MDA(&this->video_);
  KeyboardController::KeyboardController(&this->keyboard_,&this->pic_);
  FloppyController::FloppyController(&this->fdc_,&this->pic_,&this->dma_,1);
  PITObserver::PITObserver(&this->pit_observer_,&this->pic_,&this->speaker_);
  i8255PortHandler::i8255PortHandler(&this->ppi_handler_,&this->speaker_,&this->keyboard_,MDA,1);
  i8253<false,_PCCompatible::PITObserver>::i8253(&this->pit_,&this->pit_observer_);
  Intel::i8255::i8255<PCCompatible::i8255PortHandler>::i8255(&this->ppi_,&this->ppi_handler_);
  RTC::RTC(&this->rtc_);
  PCCompatible::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_);
  Context::Context(&this->context,&this->pit_,&this->dma_,&this->ppi_,&this->pic_,&this->video_,
                   &this->fdc_,&this->rtc_);
  InstructionSet::x86::Decoder8086::Decoder8086(&this->decoder);
  this->decoded_ip_ = 0;
  std::pair<int,_InstructionSet::x86::Instruction<false>_>::
  pair<int,_InstructionSet::x86::Instruction<false>,_true>(&this->decoded);
  this->cpu_divisor_ = 0;
  this->speed_ = ApproximatelyOriginal;
  this->speed_ = *(Speed *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc);
  DMA::set_memory(&this->dma_,&(this->context).memory);
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,1193182.0);
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>::set_input_rate
            (&(this->speaker_).speaker.
              super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>,1193182.0);
  font = PCCompatibleGLaBIOS;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x51;
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x53;
  ROM::Request::Request(&local_e8,PCCompatibleGLaBIOS,false);
  ROM::Request::Request(&local_110,PCCompatibleGLaTICK,true);
  ROM::Request::operator&&(&local_c0,&local_e8,&local_110);
  ROM::Request::Request
            ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,PCCompatibleMDAFont,
             false);
  ROM::Request::operator&&
            ((Request *)local_98,&local_c0,
             (Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ROM::Request::~Request(&local_c0);
  ROM::Request::~Request(&local_110);
  ROM::Request::~Request(&local_e8);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&bios_contents,local_20,(Request *)local_98);
  bVar1 = ROM::Request::validate((Request *)local_98,(Map *)&bios_contents);
  if (bVar1) {
    tick_contents =
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&bios_contents,&font);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&tick_contents);
    this_00 = &ppVar3->second;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_00);
    length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
    Memory::install(&(this->context).memory,0x100000 - sVar4,puVar5,length);
    local_180._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&bios_contents,
                (key_type *)
                ((long)&request.node.children.
                        super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    font_contents =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&bios_contents);
    bVar1 = std::operator!=(&local_180,(_Self *)&font_contents);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_180);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&ppVar3->second);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_180);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&ppVar3->second);
      Memory::install(&(this->context).memory,0xd0000,puVar5,sVar4);
    }
    local_198._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&bios_contents,
                (key_type *)
                &request.node.children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_198);
    local_190 = &ppVar3->second;
    ram = Memory::at(&(this->context).memory,0xb0000);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1b0,local_190);
    MDA::set_source(&this->video_,ram,&local_1b0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b0);
    (*(this->super_Machine)._vptr_Machine[7])(this,&rom_fetcher_local->_M_invoker);
    std::
    map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)&bios_contents);
    ROM::Request::~Request((Request *)local_98);
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(
			const Analyser::Static::PCCompatible::Target &target,
			const ROMMachine::ROMFetcher &rom_fetcher
		) :
			keyboard_(pic_),
			fdc_(pic_, dma_, DriveCount),
			pit_observer_(pic_, speaker_),
			ppi_handler_(speaker_, keyboard_, video, DriveCount),
			pit_(pit_observer_),
			ppi_(ppi_handler_),
			context(pit_, dma_, ppi_, pic_, video_, fdc_, rtc_)
		{
			// Capture speed.
			speed_ = target.speed;

			// Set up DMA source/target.
			dma_.set_memory(&context.memory);

			// Use clock rate as a MIPS count; keeping it as a multiple or divisor of the PIT frequency is easy.
			static constexpr int pit_frequency = 1'193'182;
			set_clock_rate(double(pit_frequency));
			speaker_.speaker.set_input_rate(double(pit_frequency));

			// Fetch the BIOS. [8088 only, for now]
			const auto bios = ROM::Name::PCCompatibleGLaBIOS;
			const auto tick = ROM::Name::PCCompatibleGLaTICK;
			const auto font = Video::FontROM;

			ROM::Request request = ROM::Request(bios) && ROM::Request(tick, true) && ROM::Request(font);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// A BIOS is mandatory.
			const auto &bios_contents = roms.find(bios)->second;
			context.memory.install(0x10'0000 - bios_contents.size(), bios_contents.data(), bios_contents.size());

			// If found, install GlaTICK at 0xd'0000.
			auto tick_contents = roms.find(tick);
			if(tick_contents != roms.end()) {
				context.memory.install(0xd'0000, tick_contents->second.data(), tick_contents->second.size());
			}

			// Give the video card something to read from.
			const auto &font_contents = roms.find(font)->second;
			video_.set_source(context.memory.at(Video::BaseAddress), font_contents);

			// ... and insert media.
			insert_media(target.media);
		}